

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

bool __thiscall cs::token_id::dump(token_id *this,ostream *o)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(o,"< ID = \"");
  poVar1 = std::operator<<(poVar1,(string *)&(this->mId).m_id);
  std::operator<<(poVar1,"\" >");
  return true;
}

Assistant:

bool dump(std::ostream &o) const override
		{
			o << "< ID = \"" << mId.get_id() << "\" >";
			return true;
		}